

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParserProbModelXML.cpp
# Opt level: O1

double __thiscall
ParserProbModelXML::GetPotential
          (ParserProbModelXML *this,string *var_name,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>_>
          *t0_deps,map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>_>
                   *t1_deps,bool isUtility)

{
  undefined4 uVar1;
  xmlNodeSetPtr pxVar2;
  undefined1 auVar3 [16];
  xmlXPathObjectPtr pxVar4;
  int iVar5;
  ostream *poVar6;
  xmlNodePtr pxVar7;
  EParse *pEVar8;
  long *plVar9;
  const_iterator cVar10;
  size_type *psVar11;
  long lVar12;
  char *pcVar13;
  ParserProbModelXML *this_00;
  xmlNodePtr pxVar14;
  bool bVar15;
  undefined1 auVar16 [64];
  string CPD_type;
  stringstream xpath_ss;
  double local_360;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_358;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>_>
  *local_338;
  ParserProbModelXML *local_330;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>_>
  *local_328;
  undefined1 local_320 [32];
  xmlXPathObjectPtr local_300;
  string local_2f8;
  string local_2d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_298;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>_>
  local_278;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>_>
  local_248;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>_>
  local_218;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>_>
  local_1e8;
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  undefined1 extraout_var [56];
  
  local_328 = &t0_deps->_M_t;
  std::__cxx11::stringstream::stringstream(local_1b8);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_1a8,"/ProbModelXML/ProbNet/Potentials/Potential",0x2a);
  if (isUtility) {
    std::__ostream_insert<char,std::char_traits<char>>
              (local_1a8,"[@role=\'utility\']/UtilityVariable[starts-with(@name, \"",0x36);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       (local_1a8,(var_name->_M_dataplus)._M_p,var_name->_M_string_length);
    lVar12 = 0x29;
    pcVar13 = "\")]/following-sibling::Variables/Variable";
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              (local_1a8,
               "[@role=\'conditionalProbability\']/Variables/Variable[@timeSlice=\'1\' and contains(@name, \""
               ,0x58);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       (local_1a8,(var_name->_M_dataplus)._M_p,var_name->_M_string_length);
    lVar12 = 3;
    pcVar13 = "\")]";
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,pcVar13,lVar12);
  std::__cxx11::stringbuf::str();
  this_00 = (ParserProbModelXML *)local_320._0_8_;
  local_300 = GetNodesMatchingExpression(this,(xmlChar *)local_320._0_8_,(xmlNodePtr)0x0);
  if ((ParserProbModelXML *)local_320._0_8_ != (ParserProbModelXML *)(local_320 + 0x10)) {
    this_00 = (ParserProbModelXML *)(local_320._16_8_ + 1);
    operator_delete((void *)local_320._0_8_,(ulong)this_00);
  }
  if (local_300 == (xmlXPathObjectPtr)0x0) {
    pEVar8 = (EParse *)__cxa_allocate_exception(0x28);
    std::operator+(&local_298,"Could not find CPD for variable ",var_name);
    EParse::EParse(pEVar8,&local_298);
    __cxa_throw(pEVar8,&EParse::typeinfo,E::~E);
  }
  pxVar2 = local_300->nodesetval;
  pxVar14 = *pxVar2->nodeTab;
  if (!isUtility) {
    local_338 = &t1_deps->_M_t;
    local_330 = this;
    if (pxVar2->nodeNr < 1) {
      bVar15 = false;
    }
    else {
      lVar12 = 0;
      do {
        pxVar14 = pxVar2->nodeTab[lVar12];
        pxVar7 = (xmlNodePtr)xmlFirstElementChild(pxVar14->parent);
        if ((pxVar14 == pxVar7) &&
           (GetVariableName_abi_cxx11_((string *)local_320,this_00,pxVar14),
           local_320._8_8_ == var_name->_M_string_length)) {
          if (local_320._8_8_ == 0) {
            bVar15 = true;
          }
          else {
            this_00 = (ParserProbModelXML *)(var_name->_M_dataplus)._M_p;
            iVar5 = bcmp((void *)local_320._0_8_,this_00,local_320._8_8_);
            bVar15 = iVar5 == 0;
          }
        }
        else {
          bVar15 = false;
        }
        if ((pxVar14 == pxVar7) &&
           ((ParserProbModelXML *)local_320._0_8_ != (ParserProbModelXML *)(local_320 + 0x10))) {
          this_00 = (ParserProbModelXML *)(local_320._16_8_ + 1);
          operator_delete((void *)local_320._0_8_,(ulong)this_00);
        }
        t1_deps = (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>_>
                   *)local_338;
        this = local_330;
        if (bVar15) goto LAB_00457cb3;
        lVar12 = lVar12 + 1;
      } while (lVar12 < pxVar2->nodeNr);
    }
    t1_deps = (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>_>
               *)local_338;
    this = local_330;
    if (!bVar15) {
      pEVar8 = (EParse *)__cxa_allocate_exception(0x28);
      std::operator+(&local_358,"Could not find CPD for variable ",var_name);
      plVar9 = (long *)std::__cxx11::string::append((char *)&local_358);
      local_2d8._M_dataplus._M_p = (pointer)*plVar9;
      psVar11 = (size_type *)(plVar9 + 2);
      if ((size_type *)local_2d8._M_dataplus._M_p == psVar11) {
        local_2d8.field_2._M_allocated_capacity = *psVar11;
        local_2d8.field_2._8_8_ = plVar9[3];
        local_2d8._M_dataplus._M_p = (pointer)&local_2d8.field_2;
      }
      else {
        local_2d8.field_2._M_allocated_capacity = *psVar11;
      }
      local_2d8._M_string_length = plVar9[1];
      *plVar9 = (long)psVar11;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      EParse::EParse(pEVar8,&local_2d8);
      __cxa_throw(pEVar8,&EParse::typeinfo,E::~E);
    }
  }
LAB_00457cb3:
  pxVar14 = pxVar14->parent->parent;
  pcVar13 = (char *)xmlGetProp(pxVar14,"type");
  pxVar4 = local_300;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_358,pcVar13,(allocator<char> *)&local_2b8);
  iVar5 = std::__cxx11::string::compare((char *)&local_358);
  if (iVar5 == 0) {
    cVar10 = std::
             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>_>
             ::find(&t1_deps->_M_t,var_name);
    uVar1 = *(undefined4 *)&cVar10._M_node[2].field_0x4;
    auVar16._0_8_ = xmlXPathFreeObject(pxVar4);
    auVar16._8_56_ = extraout_var;
    auVar3 = vcvtusi2sd_avx512f(auVar16._0_16_,uVar1);
    local_360 = 1.0 / auVar3._0_8_;
  }
  else {
    iVar5 = std::__cxx11::string::compare((char *)&local_358);
    if (iVar5 == 0) {
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>_>
      ::_Rb_tree(&local_1e8,local_328);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>_>
      ::_Rb_tree(&local_218,&t1_deps->_M_t);
      local_360 = QueryTable(this,pxVar14,
                             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>_>
                              *)&local_1e8,
                             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>_>
                              *)&local_218);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>_>
      ::~_Rb_tree(&local_218);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>_>
      ::~_Rb_tree(&local_1e8);
      xmlXPathFreeObject(pxVar4);
    }
    else {
      iVar5 = std::__cxx11::string::compare((char *)&local_358);
      if (iVar5 != 0) {
        pEVar8 = (EParse *)__cxa_allocate_exception(0x28);
        std::operator+(&local_2b8,"CPD type \"",&local_358);
        plVar9 = (long *)std::__cxx11::string::append((char *)&local_2b8);
        local_2f8._M_dataplus._M_p = (pointer)*plVar9;
        psVar11 = (size_type *)(plVar9 + 2);
        if ((size_type *)local_2f8._M_dataplus._M_p == psVar11) {
          local_2f8.field_2._M_allocated_capacity = *psVar11;
          local_2f8.field_2._8_8_ = plVar9[3];
          local_2f8._M_dataplus._M_p = (pointer)&local_2f8.field_2;
        }
        else {
          local_2f8.field_2._M_allocated_capacity = *psVar11;
        }
        local_2f8._M_string_length = plVar9[1];
        *plVar9 = (long)psVar11;
        plVar9[1] = 0;
        *(undefined1 *)(plVar9 + 2) = 0;
        EParse::EParse(pEVar8,&local_2f8);
        __cxa_throw(pEVar8,&EParse::typeinfo,E::~E);
      }
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>_>
      ::_Rb_tree(&local_248,local_328);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>_>
      ::_Rb_tree(&local_278,&t1_deps->_M_t);
      local_360 = QueryADD(this,pxVar14,pxVar14,
                           (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>_>
                            *)&local_248,
                           (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>_>
                            *)&local_278);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>_>
      ::~_Rb_tree(&local_278);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>_>
      ::~_Rb_tree(&local_248);
      xmlXPathFreeObject(pxVar4);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_358._M_dataplus._M_p != &local_358.field_2) {
    operator_delete(local_358._M_dataplus._M_p,local_358.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return local_360;
}

Assistant:

double ParserProbModelXML::GetPotential(const std::string var_name,
                                        const std::map<std::string, std::pair<Index, Index> > t0_deps, 
                                        const std::map<std::string, std::pair<Index, Index> > t1_deps,
                                        const bool isUtility)
{
    stringstream xpath_ss;
    xmlXPathObjectPtr var_nodes;
    xpath_ss << "/ProbModelXML/ProbNet/Potentials/Potential";
    if(!isUtility)
    {
        xpath_ss << "[@role='conditionalProbability']/Variables/Variable[@timeSlice='1' and contains(@name, \"" 
                 << var_name << "\")]";
    }
    else
    {
        xpath_ss << "[@role='utility']/UtilityVariable[starts-with(@name, \"" 
                 << var_name << "\")]/following-sibling::Variables/Variable";
    }
    var_nodes = GetNodesMatchingExpression((xmlChar*) xpath_ss.str().c_str());
    if(var_nodes == NULL)
        throw EParse("Could not find CPD for variable " + var_name);

    xmlNodeSetPtr var_nodeset = var_nodes->nodesetval;
    xmlNodePtr top = var_nodeset->nodeTab[0];
    if(!isUtility)
    {
        bool cpd_found = false;
        for(int i = 0; !cpd_found && i < var_nodeset->nodeNr; i++)
        {
            top = var_nodeset->nodeTab[i];
            cpd_found = (top == xmlFirstElementChild(top->parent) &&
                         GetVariableName(top) == var_name); //this prevents possible partial matchings in the variable name
        }

        if(!cpd_found)
            throw EParse("Could not find CPD for variable " + var_name + "(empty potential)");
    }
    xmlNodePtr parent = top->parent->parent;
    string CPD_type = (char*) xmlGetProp(parent, (xmlChar*) "type"); //Potential
    if(CPD_type == "Uniform")
    {
        map<string, pair<Index, Index> >::const_iterator it = t1_deps.find(var_name);
        double p = 1.0/(it->second.second);
        if(DEBUG_PARSE)
        {
              cout << "Output: " << var_name << "=" << it->second.first << " | Input: Uniform | " << "p=" << p << endl;
        }
        xmlXPathFreeObject (var_nodes);
        return p;
    }
    else if(CPD_type == "Table")
    {
        double p = QueryTable(parent, t0_deps, t1_deps);
        xmlXPathFreeObject (var_nodes);
        return p;
    }
    else if(CPD_type == "Tree/ADD")
    {
        double p = QueryADD(parent, parent, t0_deps, t1_deps);
        xmlXPathFreeObject (var_nodes);
        return p;
    }
    else
    {
        throw EParse("CPD type \"" + CPD_type + "\" not supported.");
    }
}